

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDepends
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  bool bVar1;
  TargetType TVar2;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmLocalGenerator *this_01;
  string *psVar3;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_02;
  reference this_03;
  cmGeneratorTarget *pcVar4;
  iterator __first;
  iterator __last;
  cmTargetDepend *targetDep;
  iterator __end2_1;
  iterator __begin2_1;
  TargetDependSet *__range2_1;
  cmNinjaDeps outs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string d;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *util;
  iterator __end2;
  iterator __begin2;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  cmNinjaTargetDepends depends_local;
  cmNinjaDeps *outputs_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == GLOBAL_TARGET) {
    this_00 = cmGeneratorTarget::GetUtilities_abi_cxx11_(target);
    __end2 = std::
             set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    util = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           std::
           set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&util), bVar1) {
      d.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end2);
      this_01 = cmGeneratorTarget::GetLocalGenerator(target);
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
      std::operator+(&local_88,psVar3,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     &local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     d.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_88);
      psVar3 = ConvertToNinjaPath(this,(string *)local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outputs,psVar3);
      std::__cxx11::string::~string((string *)local_68);
      std::
      _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2_1);
    this_02 = &cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target)->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
    ;
    __end2_1 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               ::begin(this_02);
    targetDep = (cmTargetDepend *)
                std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                ::end(this_02);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&targetDep), bVar1) {
      this_03 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end2_1);
      pcVar4 = cmTargetDepend::operator->(this_03);
      TVar2 = cmGeneratorTarget::GetType(pcVar4);
      if (TVar2 != INTERFACE_LIBRARY) {
        pcVar4 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_03);
        AppendTargetOutputs(this,pcVar4,(cmNinjaDeps *)&__range2_1,depends);
      }
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end2_1);
    }
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2_1);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2_1);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (outputs,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDepends(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  if (target->GetType() == cmStateEnums::GLOBAL_TARGET) {
    // These depend only on other CMake-provided targets, e.g. "all".
    for (BT<std::string> const& util : target->GetUtilities()) {
      std::string d =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() + "/" +
        util.Value;
      outputs.push_back(this->ConvertToNinjaPath(d));
    }
  } else {
    cmNinjaDeps outs;
    for (cmTargetDepend const& targetDep :
         this->GetTargetDirectDepends(target)) {
      if (targetDep->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->AppendTargetOutputs(targetDep, outs, depends);
    }
    std::sort(outs.begin(), outs.end());
    cmAppend(outputs, outs);
  }
}